

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_index.h
# Opt level: O2

void __thiscall BufferIndex<double,_long>::index_size(BufferIndex<double,_long> *this)

{
  size_type sVar1;
  leaf_node *plVar2;
  size_t sVar3;
  leaf_node *plVar4;
  leaf_node *plVar5;
  ostream *poVar6;
  ulong uVar7;
  unsigned_short uVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  undefined1 auVar13 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar14 [16];
  undefined1 in_ZMM1 [64];
  
  auVar14 = in_ZMM1._0_16_;
  auVar13 = in_ZMM0._0_16_;
  sVar1 = (this->btree).m_stats.leaves;
  lVar11 = sVar1 * 0x10 + ((this->btree).m_stats.innernodes + sVar1) * 0x100 + 0x58;
  lVar12 = ((this->right_buffer).number + (this->left_buffer).number) * 0x10;
  plVar5 = (this->btree).m_headleaf;
  plVar2 = (this->btree).m_tailleaf;
  lVar10 = 0x10000;
  uVar7 = 0;
  while( true ) {
    if (plVar2 == (leaf_node *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = (plVar2->super_node).slotuse;
    }
    if ((plVar2 == plVar5) && ((unsigned_short)uVar7 == uVar8)) break;
    sVar3 = plVar5->slotdata[uVar7]->size;
    lVar10 = lVar10 + sVar3 * 0x10 + 0x8000;
    lVar12 = lVar12 + (sVar3 + (plVar5->slotdata[uVar7]->buffer).number) * 0x10;
    uVar9 = (uint)(plVar5->super_node).slotuse;
    if ((int)uVar7 + 1U < uVar9) {
      uVar7 = uVar7 + 1;
      lVar11 = lVar11 + 0x30;
    }
    else {
      plVar4 = plVar5->nextleaf;
      if (plVar4 != (leaf_node *)0x0) {
        plVar5 = plVar4;
      }
      uVar7 = (ulong)uVar9;
      if (plVar4 != (leaf_node *)0x0) {
        uVar7 = 0;
      }
      lVar11 = lVar11 + 0x30;
    }
  }
  std::operator<<((ostream *)&std::cout,"Total size: ");
  auVar13 = vcvtusi2sd_avx512f(auVar13,lVar10 + lVar11);
  poVar6 = std::ostream::_M_insert<double>(auVar13._0_8_ * 9.5367431640625e-07);
  poVar6 = std::operator<<(poVar6," MB");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::operator<<((ostream *)&std::cout,"Model size: ");
  auVar13 = vcvtusi2sd_avx512f(auVar14,lVar11);
  poVar6 = std::ostream::_M_insert<double>(auVar13._0_8_ * 9.5367431640625e-07);
  poVar6 = std::operator<<(poVar6," MB");
  std::endl<char,std::char_traits<char>>(poVar6);
  std::operator<<((ostream *)&std::cout,"Fill rate: ");
  auVar13 = vcvtusi2sd_avx512f(auVar14,lVar12);
  auVar14 = vcvtusi2sd_avx512f(auVar14,lVar10);
  poVar6 = std::ostream::_M_insert<double>((auVar13._0_8_ * 100.0) / auVar14._0_8_);
  poVar6 = std::operator<<(poVar6,"%");
  std::endl<char,std::char_traits<char>>(poVar6);
  return;
}

Assistant:

void index_size() const {
        size_t model_size = 0;
        size_t slot_size = 0;
        size_t data_size = 0;
        model_size += sizeof(*this) - 2 * RESERVE * (sizeof(K) + sizeof(P)) + (btree.get_stats().innernodes * btree.get_stats().innerslots + btree.get_stats().leaves * btree.get_stats().leafslots) * (sizeof(K) + sizeof(void*)) + btree.get_stats().leaves * sizeof(void*) * 2;
        slot_size += 2 * RESERVE * (sizeof(K) + sizeof(P));
        data_size += (left_buffer.number + right_buffer.number) * (sizeof(K) + sizeof(P));
        auto it = btree.begin();
        while (it != btree.end()) {
            it->second->node_size(model_size, slot_size, data_size);
            it++;
        }

        std::cout << "Total size: " << (double)(model_size+slot_size)/(1024*1024) << " MB" << std::endl;
        std::cout << "Model size: " << (double)model_size/(1024*1024) << " MB" << std::endl;
        std::cout << "Fill rate: " << (double)100*data_size/slot_size << "%" << std::endl;
    }